

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

deUint32 vkt::sr::anon_unknown_0::getNextMultiple
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *divisors,deUint32 value)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  undefined8 local_28;
  size_t divNdx;
  undefined4 local_18;
  bool nextMultipleFound;
  deUint32 nextMultiple;
  deUint32 value_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *divisors_local;
  
  local_18 = value;
  while( true ) {
    bVar1 = true;
    local_28 = 0;
    while( true ) {
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(divisors);
      if (sVar3 <= local_28) break;
      bVar2 = false;
      if (bVar1) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (divisors,local_28);
        bVar2 = local_18 % *pvVar4 == 0;
      }
      bVar1 = bVar2;
      local_28 = local_28 + 1;
    }
    if (bVar1) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](divisors,0);
    local_18 = getNextMultiple(*pvVar4,local_18 + 1);
  }
  return local_18;
}

Assistant:

static deUint32 getNextMultiple (const std::vector<deUint32>& divisors, deUint32 value)
{
	deUint32	nextMultiple		= value;
	bool		nextMultipleFound	= false;

	while (true)
	{
		nextMultipleFound = true;

		for (size_t divNdx = 0; divNdx < divisors.size(); divNdx++)
			nextMultipleFound = nextMultipleFound && (nextMultiple % divisors[divNdx] == 0);

		if (nextMultipleFound)
			break;

		DE_ASSERT(nextMultiple < ~((deUint32)0u));
		nextMultiple = getNextMultiple(divisors[0], nextMultiple + 1);
	}

	return nextMultiple;
}